

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_spfgmr_serial.c
# Opt level: O0

int PSolve(void *Data,N_Vector r_vec,N_Vector z_vec,realtype tol,int lr)

{
  int iVar1;
  realtype *flagvalue;
  realtype *flagvalue_00;
  realtype *flagvalue_01;
  UserData *ProbData;
  sunindextype i;
  realtype *d;
  realtype *z;
  realtype *r;
  int lr_local;
  realtype tol_local;
  N_Vector z_vec_local;
  N_Vector r_vec_local;
  void *Data_local;
  
  flagvalue = N_VGetArrayPointer(r_vec);
  iVar1 = check_flag(flagvalue,"N_VGetArrayPointer",0);
  if (iVar1 == 0) {
    flagvalue_00 = N_VGetArrayPointer(z_vec);
    iVar1 = check_flag(flagvalue_00,"N_VGetArrayPointer",0);
    if (iVar1 == 0) {
      flagvalue_01 = N_VGetArrayPointer(*(N_Vector *)((long)Data + 8));
      iVar1 = check_flag(flagvalue_01,"N_VGetArrayPointer",0);
      if (iVar1 == 0) {
        for (ProbData = (UserData *)0x0; (long)ProbData < *Data;
            ProbData = (UserData *)((long)&ProbData->N + 1)) {
          flagvalue_00[(long)ProbData] = flagvalue[(long)ProbData] / flagvalue_01[(long)ProbData];
        }
        Data_local._4_4_ = 0;
      }
      else {
        Data_local._4_4_ = 1;
      }
    }
    else {
      Data_local._4_4_ = 1;
    }
  }
  else {
    Data_local._4_4_ = 1;
  }
  return Data_local._4_4_;
}

Assistant:

int PSolve(void* Data, N_Vector r_vec, N_Vector z_vec, realtype tol, int lr)
{
  /* local variables */
  realtype *r, *z, *d;
  sunindextype i;
  UserData *ProbData;
  
  /* access user data structure and vector data */
  ProbData = (UserData *) Data;
  r = N_VGetArrayPointer(r_vec);
  if (check_flag(r, "N_VGetArrayPointer", 0)) return 1;
  z = N_VGetArrayPointer(z_vec);
  if (check_flag(z, "N_VGetArrayPointer", 0)) return 1;
  d = N_VGetArrayPointer(ProbData->d);
  if (check_flag(d, "N_VGetArrayPointer", 0)) return 1;
  
  /* iterate through domain, performing Jacobi solve */
  for (i=0; i<ProbData->N; i++) 
    z[i] = r[i] / d[i];

  /* return with success */
  return 0;
}